

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchFromZeroIndefiniteAwait_Test *this)

{
  future_status fVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  _Result<void> *p_Var3;
  char *in_R9;
  _State_baseV2 *__tmp;
  __allocator_type __a2;
  __allocator_type __a2_1;
  AssertionResult gtest_ar_;
  string local_d8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_b0;
  thread local_a8;
  future<void> asyncFuture;
  CountdownLatch latch;
  
  bidfx_public_api::tools::CountdownLatch::CountdownLatch(&latch,0);
  gtest_ar_.success_ = false;
  gtest_ar_._1_7_ = 0;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x50);
  pbVar2->_M_string_length = 0x100000001;
  (pbVar2->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00272898;
  *(undefined8 *)((long)&pbVar2->field_2 + 8) = 0;
  *(undefined4 *)&pbVar2[1]._M_dataplus._M_p = 0;
  *(undefined1 *)((long)&pbVar2[1]._M_dataplus._M_p + 4) = 0;
  *(undefined4 *)&pbVar2[1]._M_string_length = 0;
  local_d8._M_dataplus._M_p = (pointer)&__a2;
  pbVar2[1].field_2._M_allocated_capacity = 0;
  *(undefined4 *)((long)&pbVar2[1].field_2 + 8) = 0;
  (pbVar2->field_2)._M_allocated_capacity = (size_type)&PTR___Async_state_impl_002728e8;
  local_d8._M_string_length = (size_type)pbVar2;
  p_Var3 = (_Result<void> *)operator_new(0x10);
  *(undefined8 *)p_Var3 = 0;
  *(undefined8 *)&p_Var3->field_0x8 = 0;
  std::__future_base::_Result<void>::_Result(p_Var3);
  pbVar2[2]._M_dataplus._M_p = (pointer)p_Var3;
  pbVar2[2]._M_string_length = (size_type)&latch;
  local_a8._M_id._M_thread = (id)0;
  ___a2_1 = (long *)operator_new(0x20);
  *___a2_1 = (long)&PTR___State_00272940;
  ___a2_1[1] = (long)&pbVar2->field_2;
  ___a2_1[2] = (long)std::__future_base::
                     _Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp:85:33)>_>,_void>
                     ::_M_run;
  ___a2_1[3] = 0;
  std::thread::_M_start_thread(&local_a8,&__a2_1,0);
  if (___a2_1 != (long *)0x0) {
    (**(code **)(*___a2_1 + 8))();
  }
  std::thread::operator=((thread *)&pbVar2[1].field_2._M_allocated_capacity,&local_a8);
  std::thread::~thread(&local_a8);
  local_d8._M_string_length = 0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp:85:33)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp:85:33)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bidfx[P]bidfx_api_cpp_test_tools_countdown_latch_test_cpp:85:33)>_>,_void>,_std::allocator<std::__future_base::_Async_state_impl<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bidfx[P]bidfx_api_cpp_test_tools_countdown_latch_test_cpp:85:33)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                      *)&local_d8);
  local_b8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_d8._M_dataplus._M_p = (pointer)gtest_ar_._0_8_;
  local_d8._M_string_length = (size_type)gtest_ar_.message_.ptr_;
  gtest_ar_._0_8_ = &pbVar2->field_2;
  gtest_ar_.message_.ptr_ = pbVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
  if (gtest_ar_._0_8_ == 0) {
    pbVar2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)operator_new(0x40)
    ;
    pbVar2->_M_string_length = 0x100000001;
    (pbVar2->_M_dataplus)._M_p = (pointer)&PTR___Sp_counted_ptr_inplace_00272980;
    *(undefined8 *)((long)&pbVar2->field_2 + 8) = 0;
    *(undefined4 *)&pbVar2[1]._M_dataplus._M_p = 0;
    *(undefined1 *)((long)&pbVar2[1]._M_dataplus._M_p + 4) = 0;
    *(undefined4 *)&pbVar2[1]._M_string_length = 0;
    (pbVar2->field_2)._M_allocated_capacity = (size_type)&PTR___Deferred_state_002729d0;
    local_d8._M_dataplus._M_p = (pointer)&__a2_1;
    local_d8._M_string_length = (size_type)pbVar2;
    p_Var3 = (_Result<void> *)operator_new(0x10);
    *(undefined8 *)p_Var3 = 0;
    *(undefined8 *)&p_Var3->field_0x8 = 0;
    std::__future_base::_Result<void>::_Result(p_Var3);
    *(_Result<void> **)&pbVar2[1].field_2 = p_Var3;
    *(CountdownLatch **)((long)&pbVar2[1].field_2 + 8) = &latch;
    local_d8._M_string_length = 0;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp:85:33)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp:85:33)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bidfx[P]bidfx_api_cpp_test_tools_countdown_latch_test_cpp:85:33)>_>,_void>,_std::allocator<std::__future_base::_Deferred_state<std::thread::_Invoker<std::tuple<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_bidfx[P]bidfx_api_cpp_test_tools_countdown_latch_test_cpp:85:33)>_>,_void>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)&local_d8);
    local_b8.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    _Stack_b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_d8._M_dataplus._M_p = (pointer)gtest_ar_._0_8_;
    local_d8._M_string_length = (size_type)gtest_ar_.message_.ptr_;
    gtest_ar_._0_8_ = &pbVar2->field_2;
    gtest_ar_.message_.ptr_ = pbVar2;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_d8._M_string_length);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_b0);
  }
  std::__basic_future<void>::__basic_future
            (&asyncFuture.super___basic_future<void>,(__state_type *)&gtest_ar_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar_.message_);
  local_d8._M_dataplus._M_p = (char *)0x1388;
  fVar1 = std::__basic_future<void>::wait_for<long,std::ratio<1l,1000l>>
                    (&asyncFuture.super___basic_future<void>,
                     (duration<long,_std::ratio<1L,_1000L>_> *)&local_d8);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = fVar1 != timeout;
  if (fVar1 == timeout) {
    testing::Message::Message((Message *)&local_b8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_d8,(internal *)&gtest_ar_,
               (AssertionResult *)
               "asyncFuture.wait_for(std::chrono::milliseconds(5000)) != std::future_status::timeout"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&__a2_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x58,local_d8._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&__a2_1,(Message *)&local_b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&__a2_1);
    std::__cxx11::string::~string((string *)&local_d8);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(&local_b8);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&asyncFuture.super___basic_future<void>._M_state.
              super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::condition_variable::~condition_variable((condition_variable *)&latch);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchFromZeroIndefiniteAwait)
{
    CountdownLatch latch = CountdownLatch(0);
    auto asyncFuture = std::async(
            std::launch::async, [&latch]() {
                latch.Await();
            });
    EXPECT_TRUE(asyncFuture.wait_for(std::chrono::milliseconds(5000)) != std::future_status::timeout);
}